

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

size_t ZopfliLZ77GetByteRange(ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  ulong uVar1;
  
  if (lstart == lend) {
    return 0;
  }
  if (lz77->dists[lend - 1] == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (ulong)lz77->litlens[lend - 1];
  }
  return (uVar1 + lz77->pos[lend - 1]) - lz77->pos[lstart];
}

Assistant:

size_t ZopfliLZ77GetByteRange(const ZopfliLZ77Store* lz77,
                              size_t lstart, size_t lend) {
  size_t l = lend - 1;
  if (lstart == lend) return 0;
  return lz77->pos[l] + ((lz77->dists[l] == 0) ?
      1 : lz77->litlens[l]) - lz77->pos[lstart];
}